

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(int lhs,SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  int ret;
  uint local_20 [3];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  
  local_20[1] = 0;
  local_20[0] = rhs.m_int;
  local_20[2] = lhs;
  DivisionHelper<int,_unsigned_int,_2>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((int *)(local_20 + 2),local_20,(int *)(local_20 + 1));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_14,(int *)(local_20 + 1));
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_14.m_int
  ;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}